

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::SourceCodeInfo_Location::InternalSerializeWithCachedSizesToArray
          (SourceCodeInfo_Location *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  bool bVar2;
  uint8 *puVar3;
  byte *pbVar4;
  int iVar5;
  int iVar6;
  RepeatedField<int> *pRVar7;
  int *piVar8;
  uint64 uVar9;
  uint32 extraout_var;
  uint32 extraout_var_00;
  size_t __n;
  void *__src;
  EpsCopyOutputStream *in_RDX;
  int *piVar10;
  byte *in_RSI;
  SourceCodeInfo_Location *in_RDI;
  string *s;
  int n;
  int i;
  int byte_size_1;
  int byte_size;
  uint32 cached_has_bits;
  ptrdiff_t size;
  memory_order __b_1;
  memory_order __b;
  int *end;
  int *it;
  int *end_1;
  int *it_1;
  uint8 **in_stack_fffffffffffffca8;
  SourceCodeInfo_Location *in_stack_fffffffffffffcb0;
  string *in_stack_fffffffffffffcb8;
  uint8 *in_stack_fffffffffffffcc8;
  EpsCopyOutputStream *pEVar11;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  undefined8 in_stack_fffffffffffffcd8;
  uint32 uVar12;
  EpsCopyOutputStream *in_stack_fffffffffffffce0;
  EpsCopyOutputStream *in_stack_fffffffffffffcf8;
  EpsCopyOutputStream *in_stack_fffffffffffffd00;
  EpsCopyOutputStream *in_stack_fffffffffffffd08;
  int local_290;
  byte *local_278;
  byte *local_210;
  int *local_158;
  byte *local_148;
  byte *local_120;
  ulong local_118;
  byte *local_110;
  EpsCopyOutputStream *local_100;
  byte *local_f0;
  byte *local_c8;
  ulong local_c0;
  byte *local_b8;
  byte *local_20;
  uint local_14;
  byte *local_10;
  uint local_4;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  local_14 = (in_RDI->_path_cached_byte_size_).super___atomic_base<int>._M_i;
  local_278 = in_RSI;
  if (0 < (int)local_14) {
    pRVar7 = _internal_path(in_RDI);
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    *in_RSI = 10;
    local_20 = in_RSI + 1;
    for (; 0x7f < local_14; local_14 = local_14 >> 7) {
      *local_20 = (byte)local_14 | 0x80;
      local_20 = local_20 + 1;
    }
    local_148 = local_20 + 1;
    *local_20 = (byte)local_14;
    piVar8 = RepeatedField<int>::data((RepeatedField<int> *)0x5371c6);
    iVar5 = RepeatedField<int>::size(pRVar7);
    local_158 = piVar8;
    do {
      io::EpsCopyOutputStream::EnsureSpace
                ((EpsCopyOutputStream *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      piVar10 = local_158 + 1;
      uVar9 = io::EpsCopyOutputStream::Encode64((long)*local_158);
      if (uVar9 < 0x80) {
        *local_148 = (byte)uVar9;
        local_110 = local_148 + 1;
      }
      else {
        *local_148 = (byte)uVar9 | 0x80;
        local_118 = uVar9 >> 7;
        if (local_118 < 0x80) {
          local_148[1] = (byte)local_118;
          local_110 = local_148 + 2;
        }
        else {
          pbVar4 = local_148 + 1;
          do {
            local_120 = pbVar4;
            *local_120 = (byte)local_118 | 0x80;
            local_118 = local_118 >> 7;
            pbVar4 = local_120 + 1;
          } while (0x7f < local_118);
          local_110 = local_120 + 2;
          local_120[1] = (byte)local_118;
        }
      }
      local_148 = local_110;
      local_158 = piVar10;
    } while (piVar10 < piVar8 + iVar5);
    local_278 = local_110;
  }
  std::operator&(memory_order_relaxed,__memory_order_mask);
  uVar12 = (uint32)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
  local_4 = (in_RDI->_span_cached_byte_size_).super___atomic_base<int>._M_i;
  if (0 < (int)local_4) {
    in_stack_fffffffffffffd00 = in_RDX;
    pRVar7 = _internal_span(in_RDI);
    in_stack_fffffffffffffd08 = in_stack_fffffffffffffd00;
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    *local_278 = 0x12;
    while( true ) {
      local_10 = local_278 + 1;
      if (local_4 < 0x80) break;
      *local_10 = (byte)local_4 | 0x80;
      local_4 = local_4 >> 7;
      local_278 = local_10;
    }
    local_f0 = local_278 + 2;
    *local_10 = (byte)local_4;
    local_100 = (EpsCopyOutputStream *)RepeatedField<int>::data((RepeatedField<int> *)0x5377dd);
    in_stack_fffffffffffffcf8 = local_100;
    iVar5 = RepeatedField<int>::size(pRVar7);
    puVar3 = in_stack_fffffffffffffcf8->buffer_;
    do {
      io::EpsCopyOutputStream::EnsureSpace
                ((EpsCopyOutputStream *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      pEVar11 = (EpsCopyOutputStream *)((long)&local_100->end_ + 4);
      uVar9 = io::EpsCopyOutputStream::Encode64((long)*(int *)&local_100->end_);
      uVar12 = (uint32)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
      if (uVar9 < 0x80) {
        *local_f0 = (byte)uVar9;
        local_b8 = local_f0 + 1;
      }
      else {
        *local_f0 = (byte)uVar9 | 0x80;
        local_c0 = uVar9 >> 7;
        if (local_c0 < 0x80) {
          local_f0[1] = (byte)local_c0;
          local_b8 = local_f0 + 2;
        }
        else {
          pbVar4 = local_f0 + 1;
          do {
            local_c8 = pbVar4;
            *local_c8 = (byte)local_c0 | 0x80;
            local_c0 = local_c0 >> 7;
            pbVar4 = local_c8 + 1;
          } while (0x7f < local_c0);
          local_b8 = local_c8 + 2;
          local_c8[1] = (byte)local_c0;
        }
      }
      local_f0 = local_b8;
      local_100 = pEVar11;
    } while (pEVar11 < (EpsCopyOutputStream *)(puVar3 + (long)iVar5 * 4 + -0x10));
    local_278 = local_b8;
  }
  uVar1 = (in_RDI->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    _internal_leading_comments_abi_cxx11_((SourceCodeInfo_Location *)0x537a34);
    std::__cxx11::string::data();
    _internal_leading_comments_abi_cxx11_((SourceCodeInfo_Location *)0x537a4e);
    std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20),
               (Operation)in_stack_fffffffffffffca8,(char *)0x537a6e);
    _internal_leading_comments_abi_cxx11_((SourceCodeInfo_Location *)0x537a88);
    local_278 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                          (in_stack_fffffffffffffce0,uVar12,
                           (string *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                           in_stack_fffffffffffffcc8);
  }
  if ((uVar1 & 2) != 0) {
    _internal_trailing_comments_abi_cxx11_((SourceCodeInfo_Location *)0x537aca);
    std::__cxx11::string::data();
    uVar12 = extraout_var;
    _internal_trailing_comments_abi_cxx11_((SourceCodeInfo_Location *)0x537ae4);
    std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20),
               (Operation)in_stack_fffffffffffffca8,(char *)0x537b04);
    pEVar11 = in_RDX;
    _internal_trailing_comments_abi_cxx11_((SourceCodeInfo_Location *)0x537b1e);
    local_278 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                          (pEVar11,uVar12,
                           (string *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                           in_stack_fffffffffffffcc8);
  }
  local_290 = 0;
  iVar5 = _internal_leading_detached_comments_size((SourceCodeInfo_Location *)0x537b58);
  for (; local_290 < iVar5; local_290 = local_290 + 1) {
    _internal_leading_detached_comments_abi_cxx11_
              (in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
    std::__cxx11::string::data();
    uVar12 = extraout_var_00;
    std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20),
               (Operation)in_stack_fffffffffffffca8,(char *)0x537bc6);
    pEVar11 = in_RDX;
    __n = std::__cxx11::string::size();
    bVar2 = true;
    if ((long)__n < 0x80) {
      in_stack_fffffffffffffcb8 = (string *)(pEVar11->end_ + (0x10 - (long)local_278));
      iVar6 = io::EpsCopyOutputStream::TagSize(0x30);
      bVar2 = (long)in_stack_fffffffffffffcb8 + (-1 - (long)iVar6) < (long)__n;
    }
    if (bVar2) {
      local_210 = io::EpsCopyOutputStream::WriteStringOutline
                            (pEVar11,uVar12,in_stack_fffffffffffffcb8,
                             (uint8 *)in_stack_fffffffffffffcb0);
    }
    else {
      *local_278 = 0x32;
      local_278[1] = (byte)__n;
      in_stack_fffffffffffffcb0 = (SourceCodeInfo_Location *)(local_278 + 2);
      __src = (void *)std::__cxx11::string::data();
      memcpy(in_stack_fffffffffffffcb0,__src,__n);
      local_210 = (byte *)((long)&(((SourceCodeInfo_Location *)
                                   (&((SourceCodeInfo_Location *)(local_278 + 2))->_has_bits_ + -4))
                                  ->super_Message).super_MessageLite._vptr_MessageLite + __n);
    }
    local_278 = local_210;
  }
  if (((uint)(in_RDI->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    if (((uint)(in_RDI->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)&in_RDI->_internal_metadata_);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    local_278 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                          ((UnknownFieldSet *)in_stack_fffffffffffffd08,
                           (uint8 *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  }
  return local_278;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* SourceCodeInfo_Location::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.SourceCodeInfo.Location)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int32 path = 1 [packed = true];
  {
    int byte_size = _path_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1, _internal_path(), byte_size, target);
    }
  }

  // repeated int32 span = 2 [packed = true];
  {
    int byte_size = _span_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          2, _internal_span(), byte_size, target);
    }
  }

  cached_has_bits = _has_bits_[0];
  // optional string leading_comments = 3;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_leading_comments().data(), static_cast<int>(this->_internal_leading_comments().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.SourceCodeInfo.Location.leading_comments");
    target = stream->WriteStringMaybeAliased(
        3, this->_internal_leading_comments(), target);
  }

  // optional string trailing_comments = 4;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_trailing_comments().data(), static_cast<int>(this->_internal_trailing_comments().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.SourceCodeInfo.Location.trailing_comments");
    target = stream->WriteStringMaybeAliased(
        4, this->_internal_trailing_comments(), target);
  }

  // repeated string leading_detached_comments = 6;
  for (int i = 0, n = this->_internal_leading_detached_comments_size(); i < n; i++) {
    const auto& s = this->_internal_leading_detached_comments(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.SourceCodeInfo.Location.leading_detached_comments");
    target = stream->WriteString(6, s, target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.SourceCodeInfo.Location)
  return target;
}